

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

void Extra_ThreshCreateInequalities
               (char *pIsop,char *pIsopFneg,int nVars,int *pWofChow,int *pChow,int nChows,
               int nInequalities,unsigned_long **pGreaters,unsigned_long **pSmallers)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  long local_60;
  int local_40;
  
  sVar3 = strlen(pIsop);
  uVar5 = (ulong)(nVars + 3);
  uVar10 = 0;
  sVar4 = strlen(pIsopFneg);
  iVar2 = (int)(sVar4 / uVar5);
  local_40 = (int)(sVar3 / uVar5);
  uVar8 = (ulong)(uint)nChows;
  if (nChows < 1) {
    uVar8 = uVar10;
  }
  for (; (long)uVar10 < (long)(iVar2 * local_40); uVar10 = uVar10 + 1) {
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      pGreaters[uVar10][uVar6] = 0;
      pSmallers[uVar10][uVar6] = 0;
    }
  }
  local_60 = 0;
  uVar8 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar8 = 0;
  }
  lVar11 = 0;
  pcVar9 = pIsop;
  while( true ) {
    sVar3 = strlen(pIsop);
    if ((int)sVar3 <= local_60) break;
    lVar11 = (long)(int)lVar11;
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if (pcVar9[uVar10] == '1') {
          pGreaters[lVar11][pChow[uVar10]] = pGreaters[lVar11][pChow[uVar10]] + 1;
        }
      }
      lVar11 = lVar11 + 1;
    }
    local_60 = local_60 + uVar5;
    pcVar9 = pcVar9 + uVar5;
  }
  lVar11 = 0;
  for (iVar2 = 0; iVar2 < local_40; iVar2 = iVar2 + 1) {
    lVar11 = (long)(int)lVar11;
    lVar7 = 0;
    pcVar9 = pIsopFneg;
    while( true ) {
      sVar3 = strlen(pIsopFneg);
      if ((int)sVar3 <= lVar7) break;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if (pcVar9[uVar10] == '-') {
          pSmallers[lVar11][pChow[uVar10]] = pSmallers[lVar11][pChow[uVar10]] + 1;
        }
      }
      lVar11 = lVar11 + 1;
      lVar7 = lVar7 + uVar5;
      pcVar9 = pcVar9 + uVar5;
    }
  }
  return;
}

Assistant:

void Extra_ThreshCreateInequalities(char * pIsop, char * pIsopFneg, int nVars,
        int * pWofChow, int * pChow, int nChows, int nInequalities,
        unsigned long ** pGreaters, unsigned long ** pSmallers) {
    int i = 0, j = 0, k = 0, m = 0;

    int nCubesIsop = strlen(pIsop) / (nVars + 3);
    int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);

    for (k = 0; k < nCubesIsop * nCubesIsopFneg; k++)
        for (i = 0; i < nChows; i++) {
            pGreaters[k][i] = 0;
            pSmallers[k][i] = 0;
        }
    m = 0;
    for (i = 0; i < (int)strlen(pIsop); i += (nVars + 3))
        for (j = 0; j < nCubesIsopFneg; j++) {
            for (k = 0; k < nVars; k++)
                if (pIsop[i + k] == '1')
                    pGreaters[m][pChow[k]] = pGreaters[m][(pChow[k])] + 1;

            m++;
        }
    m = 0;
    for (i = 0; i < nCubesIsop; i++)
        for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3)) {
            for (k = 0; k < nVars; k++)
                if (pIsopFneg[j + k] == '-')
                    pSmallers[m][pChow[k]] = pSmallers[m][pChow[k]] + 1;
            m++;
        }
//        Extra_ThreshPrintInequalities( pGreaters, pSmallers, nChows, nInequalities);
//        printf( "\nInequalities was Created \n");
}